

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_keys.cpp
# Opt level: O0

bool __thiscall OneKey::check(OneKey *this,AActor *owner)

{
  bool bVar1;
  bool local_41;
  FName local_34;
  AInventory *local_30;
  AInventory *item;
  AActor *local_20;
  AActor *owner_local;
  OneKey *this_local;
  
  local_20 = owner;
  owner_local = (AActor *)this;
  bVar1 = DObject::IsKindOf((DObject *)owner,AKey::RegistrationInfo.MyClass);
  if (bVar1) {
    bVar1 = DObject::IsA((DObject *)local_20,&this->key->super_PClass);
    local_41 = true;
    if (!bVar1) {
      (*(local_20->super_DThinker).super_DObject._vptr_DObject[0x21])((long)&item + 4);
      local_41 = FName::operator==((FName *)((long)&item + 4),
                                   &(this->key->super_PClass).super_PStruct.super_PNamedType.
                                    TypeName);
    }
    this_local._7_1_ = local_41;
  }
  else {
    for (local_30 = ::TObjPtr::operator_cast_to_AInventory_((TObjPtr *)&local_20->Inventory);
        local_30 != (AInventory *)0x0;
        local_30 = ::TObjPtr::operator_cast_to_AInventory_
                             ((TObjPtr *)&(local_30->super_AActor).Inventory)) {
      bVar1 = DObject::IsA((DObject *)local_30,&this->key->super_PClass);
      if (bVar1) {
        return true;
      }
      (*(local_30->super_AActor).super_DThinker.super_DObject._vptr_DObject[0x21])(&local_34);
      bVar1 = FName::operator==(&local_34,
                                &(this->key->super_PClass).super_PStruct.super_PNamedType.TypeName);
      if (bVar1) {
        return true;
      }
    }
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool check(AActor *owner)
	{
		if (owner->IsKindOf(RUNTIME_CLASS(AKey)))
		{
			// P_GetMapColorForKey() checks the key directly
			return owner->IsA(key) || owner->GetSpecies() == key->TypeName;
		}
		else 
		{
			// Other calls check an actor that may have a key in its inventory.
			AInventory *item;

			for (item = owner->Inventory; item != NULL; item = item->Inventory)
			{
				if (item->IsA(key))
				{
					return true;
				}
				else if (item->GetSpecies() == key->TypeName)
				{
					return true;
				}
			}
			return false;
		}
	}